

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O0

void __thiscall SocketLog::disconnectAllStreams(SocketLog *this)

{
  TCPStream *this_00;
  bool bVar1;
  reference ppTVar2;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  TCPStream *stream;
  iterator __end1;
  iterator __begin1;
  vector<TCPStream_*,_std::allocator<TCPStream_*>_> *__range1;
  lock_guard<std::mutex> lockStream;
  SocketLog *this_local;
  
  lockStream._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&__range1,&this->streamMutex);
  __end1 = std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>::begin(&this->connectedStreams);
  stream = (TCPStream *)
           std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>::end(&this->connectedStreams);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<TCPStream_**,_std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>_>
                                *)&stream);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<TCPStream_**,_std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppTVar2;
    TCPStream::send(this_00,0x11112a,__buf,in_RCX,in_R8D);
    if (this_00 != (TCPStream *)0x0) {
      TCPStream::~TCPStream(this_00);
      operator_delete(this_00);
    }
    __gnu_cxx::
    __normal_iterator<TCPStream_**,_std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>_>::
    operator++(&__end1);
  }
  std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>::clear(&this->connectedStreams);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range1);
  return;
}

Assistant:

void SocketLog::disconnectAllStreams() {
    std::lock_guard<std::mutex> lockStream(streamMutex);

    for(auto stream:connectedStreams) {
        stream->send("SocketLog say Bye!\n");
        delete stream;
    }
    connectedStreams.clear();
}